

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * get_next_arg(int *i,int argc,char **argv,string *flag,gpt_params *params)

{
  undefined8 uVar1;
  long in_RCX;
  int in_EDX;
  int *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  FILE *__stream;
  char **in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int iVar2;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if ((*in_RSI + 1 < in_EDX) && (**(char **)(in_RCX + (long)(*in_RSI + 1) * 8) != '-')) {
    *in_RSI = *in_RSI + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
    return in_RDI;
  }
  __stream = _stderr;
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"error: %s requires one argument.\n",uVar1);
  gpt_print_usage(iVar2,in_stack_ffffffffffffff98,(gpt_params *)__stream);
  exit(0);
}

Assistant:

static std::string get_next_arg(int& i, int argc, char** argv, const std::string& flag, gpt_params& params) {
    if (i + 1 < argc && argv[i + 1][0] != '-') {
        return argv[++i];
    } else {
        fprintf(stderr, "error: %s requires one argument.\n", flag.c_str());
        gpt_print_usage(argc, argv, params);
        exit(0);
    }
}